

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

void snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  int *piVar13;
  
  uVar1 = cf->can_id;
  if ((uVar1 >> 0x1d & 1) != 0) {
    if (0x200 < (uVar1 & 0x1fffffff)) {
      fprintf(_stderr,"Error class %#x is invalid\n");
      return;
    }
    pcVar5 = ",";
    if (sep != (char *)0x0) {
      pcVar5 = sep;
    }
    piVar13 = &error_classes_rel;
    lVar12 = 0;
    iVar6 = 0;
    iVar10 = 0;
    do {
      uVar11 = (uint)lVar12;
      if ((uVar1 >> (uVar11 & 0x1f) & 1) != 0) {
        if (iVar6 != 0) {
          uVar7 = len - (long)iVar10;
          uVar2 = snprintf(buf + iVar10,uVar7,"%s",pcVar5);
          if ((int)uVar2 < 0) {
            return;
          }
          if (uVar7 <= uVar2) {
            return;
          }
          iVar10 = iVar10 + uVar2;
        }
        uVar7 = len - (long)iVar10;
        uVar2 = snprintf(buf + iVar10,uVar7,"%s",(long)&error_classes_rel + (long)*piVar13);
        if ((int)uVar2 < 0) {
          return;
        }
        if (uVar7 <= uVar2) {
          return;
        }
        iVar10 = uVar2 + iVar10;
        if (uVar11 == 3) {
          iVar3 = 0;
          sVar9 = len - (long)iVar10;
          if (sVar9 != 0) {
            pcVar8 = buf + iVar10;
            iVar3 = snprintf(pcVar8,sVar9,"{{");
            iVar4 = snprintf_error_data(pcVar8 + iVar3,sVar9 - (long)iVar3,cf->data[2],
                                        protocol_violation_types,8);
            iVar3 = iVar3 + iVar4;
            iVar4 = snprintf(pcVar8 + iVar3,sVar9 - (long)iVar3,"}{");
            iVar3 = iVar3 + iVar4;
            if ((byte)(cf->data[3] - 1) < 0x1f) {
              iVar4 = snprintf(pcVar8 + iVar3,sVar9 - (long)iVar3,"%s",
                               protocol_violation_locations_rel +
                               *(int *)(protocol_violation_locations_rel + (ulong)cf->data[3] * 4));
              iVar3 = iVar3 + iVar4;
            }
            iVar4 = snprintf(pcVar8 + iVar3,sVar9 - (long)iVar3,"}}");
            iVar3 = iVar3 + iVar4;
          }
LAB_00103ef2:
          iVar10 = iVar10 + iVar3;
        }
        else {
          if (uVar11 == 2) {
            iVar3 = 0;
            sVar9 = len - (long)iVar10;
            if (sVar9 != 0) {
              pcVar8 = buf + iVar10;
              iVar3 = snprintf(pcVar8,sVar9,"{");
              iVar4 = snprintf_error_data(pcVar8 + iVar3,sVar9 - (long)iVar3,cf->data[1],
                                          controller_problems,7);
              iVar3 = iVar3 + iVar4;
              iVar4 = snprintf(pcVar8 + iVar3,sVar9 - (long)iVar3,"}");
              iVar3 = iVar3 + iVar4;
            }
            goto LAB_00103ef2;
          }
          if (uVar11 == 1) {
            iVar3 = 0;
            sVar9 = len - (long)iVar10;
            if (sVar9 != 0) {
              iVar3 = snprintf(buf + iVar10,sVar9,"{at bit %d}",(ulong)cf->data[0]);
            }
            iVar10 = iVar10 + iVar3;
          }
        }
        iVar6 = iVar6 + 1;
      }
      lVar12 = lVar12 + 1;
      piVar13 = piVar13 + 1;
    } while (lVar12 != 9);
    if ((((cf->can_id & 0x200) != 0) || (cf->data[6] != '\0')) || (cf->data[7] != '\0')) {
      iVar6 = snprintf(buf + iVar10,len - (long)iVar10,"%s",pcVar5);
      snprintf(buf + (iVar10 + iVar6),len - (long)(iVar10 + iVar6),"error-counter-tx-rx{{%d}{%d}}",
               (ulong)cf->data[6],(ulong)cf->data[7]);
      return;
    }
  }
  return;
}

Assistant:

void snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes){
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n){
					return;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n){
				return;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			classes++;
		}
	}

	if (cf->can_id & CAN_ERR_CNT || cf->data[6] || cf->data[7]) {
		n += snprintf(buf + n, len - n, "%s", sep);
		n += snprintf(buf + n, len - n, "error-counter-tx-rx{{%d}{%d}}",
			      cf->data[6], cf->data[7]);
	}
}